

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,cmTargetExport *te)

{
  pointer pcVar1;
  ImportPropertyMap *this_00;
  bool bVar2;
  cmLocalGenerator *pcVar3;
  string *psVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  long lVar7;
  string *e_1;
  undefined1 auVar8 [8];
  char *__lhs;
  string_view separator;
  string prepro;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string exportDirs;
  string dirs;
  cmGeneratorExpression ge;
  string includes;
  string local_288;
  undefined1 local_268 [8];
  undefined1 local_260 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ImportPropertyMap *local_220;
  string *local_218;
  cmExportFileGenerator *local_210;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  long local_1c8 [2];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1b8;
  undefined1 local_1a8 [8];
  string *psStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (preprocessRule == InstallInterface) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"INTERFACE_INCLUDE_DIRECTORIES","");
    local_218 = (string *)cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    local_1b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1b8);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_1e8,(cmListFileBacktrace *)&local_1b8);
    if (local_1b8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_260._0_16_ =
         (undefined1  [16])
         cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(target->Target,te);
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)local_1a8,(cmStringRange *)local_260,separator,(string_view)ZEXT816(0));
    cmGeneratorExpression::Preprocess(&local_208,(string *)local_1a8,InstallInterface,true);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    (*this->_vptr_cmExportFileGenerator[0x13])(this,&local_208);
    local_1d8._M_allocated_capacity = (size_type)local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1e8 + 0x10),local_208._M_dataplus._M_p,
               local_208._M_dataplus._M_p + local_208._M_string_length);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_268,(string *)local_1e8);
    if ((long *)local_1d8._M_allocated_capacity != local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8[0] + 1);
    }
    auVar8 = local_268;
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
    local_1a8 = (undefined1  [8])local_198;
    local_210 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"","");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)auVar8,pcVar3,(string *)local_1a8,target,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_288);
    local_260._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_260 + 0x10);
    pcVar1 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_260,pcVar1,pcVar1 + psVar4->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if (*(bool *)((long)local_268 + 0x130) == true) {
      pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                 ,0xde);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else if ((local_218 != (string *)0x0) ||
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._8_8_ !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      if ((local_218 == (string *)0x0) ||
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
          local_218->_M_string_length != 0)) {
        local_1a8 = (undefined1  [8])0x0;
        psStack_1a0 = (string *)0x0;
        local_198[0]._M_allocated_capacity = 0;
        local_220 = properties;
        cmGeneratorExpression::Split
                  ((string *)local_260,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a8);
        psVar4 = psStack_1a0;
        local_260._8_8_ = 0;
        *(undefined1 *)&((_Alloc_hider *)local_260._0_8_)->_M_p = 0;
        if (local_1a8 != (undefined1  [8])psStack_1a0) {
          auVar8 = local_1a8;
          do {
            std::__cxx11::string::append(local_260);
            bVar2 = cmsys::SystemTools::FileIsFullPath((string *)auVar8);
            if (!bVar2) {
              lVar7 = std::__cxx11::string::find((char *)auVar8,0x6b3ff8,0);
              if (lVar7 == -1) {
                std::__cxx11::string::append(local_260);
              }
            }
            std::__cxx11::string::_M_append(local_260,(ulong)(((string *)auVar8)->_M_dataplus)._M_p)
            ;
            auVar8 = (undefined1  [8])((long)auVar8 + 0x20);
          } while (auVar8 != (undefined1  [8])psVar4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a8);
        local_1a8 = (undefined1  [8])local_198;
        if (local_218 == (string *)0x0) {
          __lhs = "";
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"","");
        }
        else {
          pcVar1 = (local_218->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar1,pcVar1 + local_218->_M_string_length);
          __lhs = ";";
        }
        this_00 = local_220;
        std::operator+(&local_288,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_260);
        std::__cxx11::string::_M_append(local_1a8,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        cmGeneratorExpression::Preprocess(&local_288,(string *)local_1a8,InstallInterface,true);
        if (local_288._M_string_length != 0) {
          pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
          ResolveTargetsInGeneratorExpression(local_210,&local_288,target,pcVar3);
          local_240._M_allocated_capacity = (size_type)&local_230;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,"INTERFACE_INCLUDE_DIRECTORIES","");
          bVar2 = checkInterfaceDirs(&local_288,target,(string *)&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_allocated_capacity != &local_230) {
            operator_delete((void *)local_240._M_allocated_capacity,
                            local_230._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_240._M_allocated_capacity = (size_type)&local_230;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_240,"INTERFACE_INCLUDE_DIRECTORIES","");
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](this_00,(key_type *)&local_240);
            std::__cxx11::string::_M_assign((string *)pmVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_allocated_capacity != &local_230) {
              operator_delete((void *)local_240._M_allocated_capacity,
                              local_230._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        local_1a8 = (undefined1  [8])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"INTERFACE_INCLUDE_DIRECTORIES","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_1a8);
        pmVar6->_M_string_length = 0;
        *(pmVar6->_M_dataplus)._M_p = '\0';
      }
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1e8);
    return;
  }
  __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportFileGenerator.cxx"
                ,0x179,
                "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, const cmTargetExport &)"
               );
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, cmTargetExport const& te)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  cmValue input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    cmJoin(target->Target->GetInstallIncludeDirectoriesEntries(te), ";"),
    preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && input->empty()) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? *input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}